

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_hash.cpp
# Opt level: O1

int __thiscall sc_core::sc_phash_base::remove(sc_phash_base *this,char *__filename)

{
  int iVar1;
  code *in_RDX;
  void *rk;
  void *rc;
  undefined8 local_18;
  
  iVar1 = remove(this,__filename);
  if (iVar1 != 0) {
    (*in_RDX)(local_18);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int
sc_phash_base::remove(const void* k, void (*kfree)(void*))
{
    void* rk;
    void* rc;
    if (remove(k, &rk, &rc)) {
        (*kfree)(rk);
        return 1;
    }
    else
        return 0;
}